

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  any local_20;
  
  pbVar1 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert(*(var **)param_2);
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_20,args,pbVar1);
    *(proxy **)&(this->mFunc).super__Function_base._M_functor = local_20.mDat;
    local_20.mDat = (proxy *)0x0;
    any::recycle(&local_20);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}